

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

array * cs_impl::string_cs_ext::split(array *__return_storage_ptr__,string *str,array *signals)

{
  char cVar1;
  char cVar2;
  _Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> *this;
  bool bVar3;
  char *pcVar4;
  char *ch;
  char *pcVar5;
  any *sig;
  _Elt_pointer this_00;
  _Elt_pointer paVar6;
  _Map_pointer ppaVar7;
  string buf;
  array *__range3;
  array arr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  char *local_a8;
  _Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> *local_a0;
  array *local_98;
  _Elt_pointer local_90;
  _Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a0 = &__return_storage_ptr__->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>
  ;
  local_98 = signals;
  std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_initialize_map(&local_88,0);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_a8 = (char *)str->_M_string_length;
  if (local_a8 != (char *)0x0) {
    pcVar5 = (str->_M_dataplus)._M_p;
    local_a8 = local_a8 + (long)pcVar5;
    bVar3 = false;
    do {
      this_00 = (local_98->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      local_90 = (local_98->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
      if (this_00 != local_90) {
        paVar6 = (local_98->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_last;
        ppaVar7 = (local_98->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                  .super__Deque_impl_data._M_start._M_node;
        do {
          cVar1 = *pcVar5;
          pcVar4 = any::const_val<char>(this_00);
          cVar2 = *pcVar4;
          if ((cVar1 == cVar2) && (bVar3 = true, local_c8._M_string_length != 0)) {
            std::deque<cs_impl::any,std::allocator<cs_impl::any>>::
            emplace_back<std::__cxx11::string&>
                      ((deque<cs_impl::any,std::allocator<cs_impl::any>> *)&local_88,&local_c8);
            local_c8._M_string_length = 0;
            *local_c8._M_dataplus._M_p = '\0';
          }
          if (cVar1 == cVar2) break;
          this_00 = this_00 + 1;
          if (this_00 == paVar6) {
            this_00 = ppaVar7[1];
            ppaVar7 = ppaVar7 + 1;
            paVar6 = this_00 + 0x40;
          }
        } while (this_00 != local_90);
      }
      if (bVar3) {
        bVar3 = false;
      }
      else {
        std::__cxx11::string::push_back((char)&local_c8);
      }
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 != local_a8);
  }
  this = local_a0;
  if (local_c8._M_string_length != 0) {
    std::deque<cs_impl::any,std::allocator<cs_impl::any>>::emplace_back<std::__cxx11::string&>
              ((deque<cs_impl::any,std::allocator<cs_impl::any>> *)&local_88,&local_c8);
  }
  std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base(this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque
            ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_88);
  return (array *)this;
}

Assistant:

array split(const string &str, const array &signals)
		{
			array
			arr;
			string buf;
			bool found = false;
			for (auto &ch: str) {
				for (auto &sig: signals) {
					if (ch == sig.const_val<char>()) {
						if (!buf.empty()) {
							arr.emplace_back(buf);
							buf.clear();
						}
						found = true;
						break;
					}
				}
				if (found)
					found = false;
				else
					buf.push_back(ch);
			}
			if (!buf.empty())
				arr.emplace_back(buf);
			return std::move(arr);
		}